

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::FileDescriptorTables::AddAliasUnderParent
          (FileDescriptorTables *this,void *parent,string *name,Symbol symbol)

{
  bool bVar1;
  char *local_48;
  undefined1 local_40 [8];
  PointerStringPair by_parent_key;
  string *name_local;
  void *parent_local;
  FileDescriptorTables *this_local;
  Symbol symbol_local;
  
  symbol_local._0_8_ = symbol.field_1;
  this_local._0_4_ = symbol.type;
  by_parent_key.second = (char *)name;
  name_local = (string *)parent;
  parent_local = this;
  local_48 = (char *)std::__cxx11::string::c_str();
  std::pair<const_void_*,_const_char_*>::pair<const_void_*&,_const_char_*,_true>
            ((pair<const_void_*,_const_char_*> *)local_40,&name_local,&local_48);
  bVar1 = InsertIfNotPresent<google::protobuf::hash_map<std::pair<void_const*,char_const*>,google::protobuf::(anonymous_namespace)::Symbol,google::protobuf::(anonymous_namespace)::PointerStringPairHash,google::protobuf::(anonymous_namespace)::PointerStringPairEqual>,std::pair<void_const*,char_const*>,google::protobuf::(anonymous_namespace)::Symbol>
                    (&this->symbols_by_parent_,(pair<const_void_*,_const_char_*> *)local_40,
                     (Symbol *)&this_local);
  return bVar1;
}

Assistant:

bool FileDescriptorTables::AddAliasUnderParent(
    const void* parent, const string& name, Symbol symbol) {
  PointerStringPair by_parent_key(parent, name.c_str());
  return InsertIfNotPresent(&symbols_by_parent_, by_parent_key, symbol);
}